

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_lite.pb.cc
# Opt level: O3

uint8_t * __thiscall
proto2_unittest::TestPackedTypesLite::_InternalSerialize
          (TestPackedTypesLite *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  anon_union_280_1_493b367e_for_TestPackedTypesLite_3 *this_00;
  RepeatedField<int> *pRVar1;
  RepeatedField<long> *this_01;
  RepeatedField<float> *this_02;
  RepeatedField<double> *this_03;
  RepeatedField<bool> *this_04;
  long *plVar2;
  int *piVar3;
  int iVar4;
  void *data;
  SooRep *pSVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  long *plVar9;
  char *pcVar10;
  byte *pbVar11;
  int *piVar12;
  ulong uVar13;
  byte *extraout_RAX;
  byte *extraout_RAX_00;
  byte *extraout_RAX_01;
  byte *extraout_RAX_02;
  byte *extraout_RAX_03;
  byte *extraout_RAX_04;
  byte *extraout_RAX_05;
  byte *pbVar14;
  uint8_t *puVar15;
  uint uVar16;
  ulong uVar17;
  LongSooRep *unaff_R12;
  LongSooRep *unaff_R13;
  byte *pbVar18;
  bool bVar19;
  
  uVar8 = *(uint *)((long)&this->field_0 + 0x10);
  if ((int)uVar8 < 1) {
LAB_001c7ece:
    uVar7 = *(uint *)((long)&this->field_0 + 0x28);
    if ((int)uVar7 < 1) goto LAB_001c7f9c;
    pbVar14 = stream->end_;
    if (pbVar14 <= target) {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      pbVar14 = stream->end_;
    }
    if (target < pbVar14) {
      unaff_R13 = (LongSooRep *)&(this->field_0)._impl_.packed_int64_;
      target[0] = 0xda;
      target[1] = 5;
      pbVar14 = target + 2;
      uVar8 = uVar7;
      if (0x7f < uVar7) goto LAB_001c88e1;
      pbVar18 = target + 1;
      goto LAB_001c7f0c;
    }
    _InternalSerialize();
    pbVar14 = extraout_RAX_00;
LAB_001c8921:
    do {
      pbVar18 = pbVar14;
      *pbVar18 = (byte)uVar7 | 0x80;
      uVar8 = uVar7 >> 7;
      pbVar14 = pbVar18 + 1;
      bVar19 = 0x3fff < uVar7;
      uVar7 = uVar8;
    } while (bVar19);
LAB_001c7fda:
    *pbVar14 = (byte)uVar8;
    if ((unaff_R13->elements_int & 4) == 0) {
      unaff_R12 = (LongSooRep *)((long)&(this->field_0)._impl_.packed_uint32_.soo_rep_.field_0 + 8);
      bVar19 = true;
    }
    else {
      unaff_R12 = (LongSooRep *)google::protobuf::internal::LongSooRep::elements(unaff_R13);
      bVar19 = (unaff_R13->elements_int & 4) == 0;
    }
    target = pbVar18 + 2;
    iVar6 = google::protobuf::internal::SooRep::size((SooRep *)unaff_R13,bVar19);
    unaff_R13 = (LongSooRep *)
                ((long)&((SooRep *)&unaff_R12->elements_int)->field_0 + (long)iVar6 * 4);
    do {
      if (stream->end_ <= target) {
        target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      }
      uVar8 = *(uint *)&((SooRep *)&unaff_R12->elements_int)->field_0;
      uVar7 = uVar8;
      if (0x7f < uVar8) {
        do {
          *target = (byte)uVar7 | 0x80;
          uVar8 = uVar7 >> 7;
          target = target + 1;
          bVar19 = 0x3fff < uVar7;
          uVar7 = uVar8;
        } while (bVar19);
      }
      unaff_R12 = (LongSooRep *)((long)&((SooRep *)&unaff_R12->elements_int)->field_0 + 4);
      *target = (byte)uVar8;
      target = target + 1;
    } while (unaff_R12 < unaff_R13);
LAB_001c8064:
    uVar7 = *(uint *)((long)&this->field_0 + 0x58);
    if ((int)uVar7 < 1) goto LAB_001c8132;
    pbVar14 = stream->end_;
    if (pbVar14 <= target) {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      pbVar14 = stream->end_;
    }
    if (target < pbVar14) {
      unaff_R13 = (LongSooRep *)&(this->field_0)._impl_.packed_uint64_;
      target[0] = 0xea;
      target[1] = 5;
      pbVar14 = target + 2;
      uVar8 = uVar7;
      if (0x7f < uVar7) goto LAB_001c8961;
      pbVar18 = target + 1;
      goto LAB_001c80a2;
    }
    _InternalSerialize();
    pbVar14 = extraout_RAX_02;
LAB_001c89a1:
    do {
      pbVar18 = pbVar14;
      *pbVar18 = (byte)uVar7 | 0x80;
      uVar8 = uVar7 >> 7;
      pbVar14 = pbVar18 + 1;
      bVar19 = 0x3fff < uVar7;
      uVar7 = uVar8;
    } while (bVar19);
LAB_001c8173:
    *pbVar14 = (byte)uVar8;
    if ((unaff_R13->elements_int & 4) == 0) {
      unaff_R12 = (LongSooRep *)((long)&(this->field_0)._impl_.packed_sint32_.soo_rep_.field_0 + 8);
      bVar19 = true;
    }
    else {
      unaff_R12 = (LongSooRep *)google::protobuf::internal::LongSooRep::elements(unaff_R13);
      bVar19 = (unaff_R13->elements_int & 4) == 0;
    }
    target = pbVar18 + 2;
    iVar6 = google::protobuf::internal::SooRep::size((SooRep *)unaff_R13,bVar19);
    pSVar5 = (SooRep *)&unaff_R12->elements_int;
    do {
      if (stream->end_ <= target) {
        target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      }
      iVar4 = *(int *)&((SooRep *)&unaff_R12->elements_int)->field_0;
      uVar7 = iVar4 >> 0x1f ^ iVar4 * 2;
      uVar8 = uVar7;
      if (0x7f < uVar7) {
        do {
          *target = (byte)uVar8 | 0x80;
          uVar7 = uVar8 >> 7;
          target = target + 1;
          bVar19 = 0x3fff < uVar8;
          uVar8 = uVar7;
        } while (bVar19);
      }
      unaff_R12 = (LongSooRep *)((long)&((SooRep *)&unaff_R12->elements_int)->field_0 + 4);
      *target = (byte)uVar7;
      target = target + 1;
    } while (unaff_R12 < (LongSooRep *)((long)&pSVar5->field_0 + (long)iVar6 * 4));
LAB_001c8203:
    uVar7 = *(uint *)((long)&this->field_0 + 0x88);
    if ((int)uVar7 < 1) goto LAB_001c82e3;
    pbVar14 = stream->end_;
    if (pbVar14 <= target) {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      pbVar14 = stream->end_;
    }
    if (target < pbVar14) {
      unaff_R13 = (LongSooRep *)&(this->field_0)._impl_.packed_sint64_;
      target[0] = 0xfa;
      target[1] = 5;
      pbVar14 = target + 2;
      uVar8 = uVar7;
      if (0x7f < uVar7) goto LAB_001c89e1;
      pbVar18 = target + 1;
      goto LAB_001c8247;
    }
    _InternalSerialize();
    pbVar14 = extraout_RAX_04;
    uVar8 = uVar7;
LAB_001c8a23:
    do {
      pbVar18 = pbVar14;
      *pbVar18 = (byte)uVar8 | 0x80;
      uVar16 = uVar8 >> 7;
      pbVar14 = pbVar18 + 1;
      bVar19 = 0x3fff < uVar8;
      uVar8 = uVar16;
    } while (bVar19);
LAB_001c834d:
    target = pbVar18 + 2;
    *pbVar14 = (byte)uVar16;
    if ((unaff_R12->elements_int & 4) == 0) {
      pcVar10 = (char *)((long)&this->field_0 + 0x98);
    }
    else {
      pcVar10 = google::protobuf::internal::LongSooRep::elements(unaff_R12);
    }
    if ((long)stream->end_ - (long)target < (long)(int)uVar7) goto LAB_001c8aa3;
    memcpy(target,pcVar10,(ulong)uVar7);
    target = target + (int)uVar7;
  }
  else {
    puVar15 = stream->end_;
    if (puVar15 <= target) {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      puVar15 = stream->end_;
    }
    if (target < puVar15) {
      this_00 = &this->field_0;
      target[0] = 0xd2;
      target[1] = '\x05';
      pbVar14 = target + 2;
      uVar7 = uVar8;
      if (uVar8 < 0x80) {
        pbVar18 = target + 1;
      }
      else {
        do {
          pbVar18 = pbVar14;
          *pbVar18 = (byte)uVar7 | 0x80;
          uVar8 = uVar7 >> 7;
          pbVar14 = pbVar18 + 1;
          bVar19 = 0x3fff < uVar7;
          uVar7 = uVar8;
        } while (bVar19);
      }
      *pbVar14 = (byte)uVar8;
      if ((undefined1  [280])((undefined1  [280])*this_00 & (undefined1  [280])0x4) ==
          (undefined1  [280])0x0) {
        unaff_R12 = (LongSooRep *)((long)&(this->field_0)._impl_.packed_int32_.soo_rep_.field_0 + 8)
        ;
        bVar19 = true;
      }
      else {
        unaff_R12 = (LongSooRep *)
                    google::protobuf::internal::LongSooRep::elements((LongSooRep *)&this_00->_impl_)
        ;
        bVar19 = (undefined1  [280])((undefined1  [280])*this_00 & (undefined1  [280])0x4) ==
                 (undefined1  [280])0x0;
      }
      target = pbVar18 + 2;
      iVar6 = google::protobuf::internal::SooRep::size((SooRep *)&this_00->_impl_,bVar19);
      unaff_R13 = (LongSooRep *)
                  ((long)&((SooRep *)&unaff_R12->elements_int)->field_0 + (long)iVar6 * 4);
      do {
        if (stream->end_ <= target) {
          target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
        }
        uVar17 = (ulong)*(int *)&((SooRep *)&unaff_R12->elements_int)->field_0;
        uVar13 = uVar17;
        if (0x7f < uVar17) {
          do {
            *target = (byte)uVar13 | 0x80;
            uVar17 = uVar13 >> 7;
            target = target + 1;
            bVar19 = 0x3fff < uVar13;
            uVar13 = uVar17;
          } while (bVar19);
        }
        unaff_R12 = (LongSooRep *)((long)&((SooRep *)&unaff_R12->elements_int)->field_0 + 4);
        *target = (byte)uVar17;
        target = target + 1;
      } while (unaff_R12 < unaff_R13);
      goto LAB_001c7ece;
    }
    _InternalSerialize();
    pbVar14 = extraout_RAX;
LAB_001c88e1:
    do {
      pbVar18 = pbVar14;
      *pbVar18 = (byte)uVar8 | 0x80;
      uVar7 = uVar8 >> 7;
      pbVar14 = pbVar18 + 1;
      bVar19 = 0x3fff < uVar8;
      uVar8 = uVar7;
    } while (bVar19);
LAB_001c7f0c:
    *pbVar14 = (byte)uVar7;
    if ((unaff_R13->elements_int & 4) == 0) {
      unaff_R12 = (LongSooRep *)
                  &(this->field_0)._impl_.packed_int64_.soo_rep_.field_0.short_rep.field_1;
      bVar19 = true;
    }
    else {
      unaff_R12 = (LongSooRep *)google::protobuf::internal::LongSooRep::elements(unaff_R13);
      bVar19 = (unaff_R13->elements_int & 4) == 0;
    }
    target = pbVar18 + 2;
    iVar6 = google::protobuf::internal::SooRep::size((SooRep *)unaff_R13,bVar19);
    unaff_R13 = (LongSooRep *)((long)unaff_R12 + (long)iVar6 * 8);
    do {
      if (stream->end_ <= target) {
        target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      }
      uVar13 = unaff_R12->elements_int;
      uVar17 = uVar13;
      if (0x7f < uVar13) {
        do {
          *target = (byte)uVar17 | 0x80;
          uVar13 = uVar17 >> 7;
          target = target + 1;
          bVar19 = 0x3fff < uVar17;
          uVar17 = uVar13;
        } while (bVar19);
      }
      unaff_R12 = (LongSooRep *)((long)unaff_R12 + 8);
      *target = (byte)uVar13;
      target = target + 1;
    } while (unaff_R12 < unaff_R13);
LAB_001c7f9c:
    uVar8 = *(uint *)((long)&this->field_0 + 0x40);
    if ((int)uVar8 < 1) goto LAB_001c8064;
    pbVar14 = stream->end_;
    if (pbVar14 <= target) {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      pbVar14 = stream->end_;
    }
    if (target < pbVar14) {
      unaff_R13 = (LongSooRep *)&(this->field_0)._impl_.packed_uint32_;
      target[0] = 0xe2;
      target[1] = 5;
      pbVar14 = target + 2;
      uVar7 = uVar8;
      if (0x7f < uVar8) goto LAB_001c8921;
      pbVar18 = target + 1;
      goto LAB_001c7fda;
    }
    _InternalSerialize();
    pbVar14 = extraout_RAX_01;
LAB_001c8961:
    do {
      pbVar18 = pbVar14;
      *pbVar18 = (byte)uVar8 | 0x80;
      uVar7 = uVar8 >> 7;
      pbVar14 = pbVar18 + 1;
      bVar19 = 0x3fff < uVar8;
      uVar8 = uVar7;
    } while (bVar19);
LAB_001c80a2:
    *pbVar14 = (byte)uVar7;
    if ((unaff_R13->elements_int & 4) == 0) {
      unaff_R12 = (LongSooRep *)
                  &(this->field_0)._impl_.packed_uint64_.soo_rep_.field_0.short_rep.field_1;
      bVar19 = true;
    }
    else {
      unaff_R12 = (LongSooRep *)google::protobuf::internal::LongSooRep::elements(unaff_R13);
      bVar19 = (unaff_R13->elements_int & 4) == 0;
    }
    target = pbVar18 + 2;
    iVar6 = google::protobuf::internal::SooRep::size((SooRep *)unaff_R13,bVar19);
    unaff_R13 = (LongSooRep *)((long)unaff_R12 + (long)iVar6 * 8);
    do {
      if (stream->end_ <= target) {
        target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      }
      uVar13 = unaff_R12->elements_int;
      uVar17 = uVar13;
      if (0x7f < uVar13) {
        do {
          *target = (byte)uVar17 | 0x80;
          uVar13 = uVar17 >> 7;
          target = target + 1;
          bVar19 = 0x3fff < uVar17;
          uVar17 = uVar13;
        } while (bVar19);
      }
      unaff_R12 = (LongSooRep *)((long)unaff_R12 + 8);
      *target = (byte)uVar13;
      target = target + 1;
    } while (unaff_R12 < unaff_R13);
LAB_001c8132:
    uVar8 = *(uint *)((long)&this->field_0 + 0x70);
    if ((int)uVar8 < 1) goto LAB_001c8203;
    pbVar14 = stream->end_;
    if (pbVar14 <= target) {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      pbVar14 = stream->end_;
    }
    if (target < pbVar14) {
      unaff_R13 = (LongSooRep *)&(this->field_0)._impl_.packed_sint32_;
      target[0] = 0xf2;
      target[1] = 5;
      pbVar14 = target + 2;
      uVar7 = uVar8;
      if (0x7f < uVar8) goto LAB_001c89a1;
      pbVar18 = target + 1;
      goto LAB_001c8173;
    }
    _InternalSerialize();
    pbVar14 = extraout_RAX_03;
LAB_001c89e1:
    do {
      pbVar18 = pbVar14;
      *pbVar18 = (byte)uVar8 | 0x80;
      uVar7 = uVar8 >> 7;
      pbVar14 = pbVar18 + 1;
      bVar19 = 0x3fff < uVar8;
      uVar8 = uVar7;
    } while (bVar19);
LAB_001c8247:
    *pbVar14 = (byte)uVar7;
    if ((unaff_R13->elements_int & 4) == 0) {
      plVar9 = (long *)((long)&this->field_0 + 0x80);
      bVar19 = true;
    }
    else {
      plVar9 = (long *)google::protobuf::internal::LongSooRep::elements(unaff_R13);
      bVar19 = (unaff_R13->elements_int & 4) == 0;
    }
    target = pbVar18 + 2;
    iVar6 = google::protobuf::internal::SooRep::size((SooRep *)unaff_R13,bVar19);
    plVar2 = plVar9 + iVar6;
    do {
      if (stream->end_ <= target) {
        target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      }
      uVar17 = *plVar9 >> 0x3f ^ *plVar9 * 2;
      uVar13 = uVar17;
      if (0x7f < uVar17) {
        do {
          *target = (byte)uVar13 | 0x80;
          uVar17 = uVar13 >> 7;
          target = target + 1;
          bVar19 = 0x3fff < uVar13;
          uVar13 = uVar17;
        } while (bVar19);
      }
      plVar9 = plVar9 + 1;
      *target = (byte)uVar17;
      target = target + 1;
    } while (plVar9 < plVar2);
LAB_001c82e3:
    unaff_R12 = (LongSooRep *)&(this->field_0)._impl_.packed_fixed32_;
    iVar6 = google::protobuf::internal::SooRep::size
                      ((SooRep *)unaff_R12,(*(byte *)((long)&this->field_0 + 0x90) & 4) == 0);
    if (0 < iVar6) {
      if (stream->end_ <= target) {
        target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      }
      iVar6 = google::protobuf::internal::SooRep::size
                        ((SooRep *)unaff_R12,
                         (undefined1  [16])
                         ((undefined1  [16])
                          (((RepeatedField<unsigned_int> *)unaff_R12)->soo_rep_).field_0 &
                         (undefined1  [16])0x4) == (undefined1  [16])0x0);
      if (stream->end_ <= target) {
        _InternalSerialize();
        pbVar14 = extraout_RAX_05;
        uVar8 = uVar7;
LAB_001c8a64:
        do {
          pbVar18 = pbVar14;
          *pbVar18 = (byte)uVar8 | 0x80;
          uVar16 = uVar8 >> 7;
          pbVar14 = pbVar18 + 1;
          bVar19 = 0x3fff < uVar8;
          uVar8 = uVar16;
        } while (bVar19);
LAB_001c83f7:
        target = pbVar18 + 2;
        *pbVar14 = (byte)uVar16;
        if ((unaff_R12->elements_int & 4) == 0) {
          pcVar10 = (char *)((long)&this->field_0 + 0xa8);
        }
        else {
          pcVar10 = google::protobuf::internal::LongSooRep::elements(unaff_R12);
        }
        if ((long)stream->end_ - (long)target < (long)(int)uVar7) goto LAB_001c8af9;
        memcpy(target,pcVar10,(ulong)uVar7);
        target = target + (int)uVar7;
        goto LAB_001c8437;
      }
      uVar7 = iVar6 << 2;
      target[0] = 0x82;
      target[1] = 6;
      pbVar14 = target + 2;
      uVar8 = uVar7;
      if (0x7f < uVar7) goto LAB_001c8a23;
      pbVar18 = target + 1;
      uVar16 = uVar7;
      goto LAB_001c834d;
    }
  }
  while( true ) {
    unaff_R12 = (LongSooRep *)&(this->field_0)._impl_.packed_fixed64_;
    iVar6 = google::protobuf::internal::SooRep::size
                      ((SooRep *)unaff_R12,(*(byte *)((long)&this->field_0 + 0xa0) & 4) == 0);
    if (iVar6 < 1) break;
    if (stream->end_ <= target) {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    bVar19 = (undefined1  [16])
             ((undefined1  [16])(((RepeatedField<unsigned_long> *)unaff_R12)->soo_rep_).field_0 &
             (undefined1  [16])0x4) == (undefined1  [16])0x0;
    pcVar10 = (char *)(ulong)bVar19;
    iVar6 = google::protobuf::internal::SooRep::size((SooRep *)unaff_R12,bVar19);
    if (target < stream->end_) {
      uVar7 = iVar6 << 3;
      target[0] = 0x8a;
      target[1] = 6;
      pbVar14 = target + 2;
      uVar8 = uVar7;
      if (0x7f < uVar7) goto LAB_001c8a64;
      pbVar18 = target + 1;
      uVar16 = uVar7;
      goto LAB_001c83f7;
    }
    _InternalSerialize();
LAB_001c8aa3:
    target = google::protobuf::io::EpsCopyOutputStream::WriteRawFallback
                       (stream,pcVar10,uVar7,target);
  }
LAB_001c8437:
  while( true ) {
    pRVar1 = &(this->field_0)._impl_.packed_sfixed32_;
    iVar6 = google::protobuf::internal::SooRep::size
                      (&pRVar1->soo_rep_,(*(byte *)((long)&this->field_0 + 0xb0) & 4) == 0);
    if (iVar6 < 1) goto LAB_001c84e1;
    if (stream->end_ <= target) {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    bVar19 = (undefined1  [16])
             ((undefined1  [16])(pRVar1->soo_rep_).field_0 & (undefined1  [16])0x4) ==
             (undefined1  [16])0x0;
    pcVar10 = (char *)(ulong)bVar19;
    iVar6 = google::protobuf::internal::SooRep::size(&pRVar1->soo_rep_,bVar19);
    if (target < stream->end_) break;
    _InternalSerialize();
LAB_001c8af9:
    target = google::protobuf::io::EpsCopyOutputStream::WriteRawFallback
                       (stream,pcVar10,uVar7,target);
  }
  uVar7 = iVar6 << 2;
  target[0] = 0x92;
  target[1] = 6;
  pbVar14 = target + 2;
  uVar8 = uVar7;
  if (uVar7 < 0x80) {
    pbVar18 = target + 1;
    uVar16 = uVar7;
  }
  else {
    do {
      pbVar18 = pbVar14;
      *pbVar18 = (byte)uVar8 | 0x80;
      uVar16 = uVar8 >> 7;
      pbVar14 = pbVar18 + 1;
      bVar19 = 0x3fff < uVar8;
      uVar8 = uVar16;
    } while (bVar19);
  }
  target = pbVar18 + 2;
  *pbVar14 = (byte)uVar16;
  if ((undefined1  [16])((undefined1  [16])(pRVar1->soo_rep_).field_0 & (undefined1  [16])0x4) ==
      (undefined1  [16])0x0) {
    pcVar10 = (char *)((long)&this->field_0 + 0xb8);
  }
  else {
    pcVar10 = google::protobuf::internal::LongSooRep::elements((LongSooRep *)pRVar1);
  }
  if ((long)stream->end_ - (long)target < (long)(int)uVar7) goto LAB_001c8b4f;
  memcpy(target,pcVar10,(ulong)uVar7);
  target = target + (int)uVar7;
LAB_001c84e1:
  this_01 = &(this->field_0)._impl_.packed_sfixed64_;
  iVar6 = google::protobuf::internal::SooRep::size
                    (&this_01->soo_rep_,(*(byte *)((long)&this->field_0 + 0xc0) & 4) == 0);
  if (iVar6 < 1) goto LAB_001c858b;
  if (stream->end_ <= target) {
    target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
  }
  bVar19 = (undefined1  [16])((undefined1  [16])(this_01->soo_rep_).field_0 & (undefined1  [16])0x4)
           == (undefined1  [16])0x0;
  pcVar10 = (char *)(ulong)bVar19;
  iVar6 = google::protobuf::internal::SooRep::size(&this_01->soo_rep_,bVar19);
  if (stream->end_ <= target) {
    _InternalSerialize();
LAB_001c8b4f:
    target = google::protobuf::io::EpsCopyOutputStream::WriteRawFallback
                       (stream,pcVar10,uVar7,target);
    goto LAB_001c84e1;
  }
  uVar7 = iVar6 << 3;
  target[0] = 0x9a;
  target[1] = 6;
  pbVar14 = target + 2;
  uVar8 = uVar7;
  if (uVar7 < 0x80) {
    pbVar18 = target + 1;
    uVar16 = uVar7;
  }
  else {
    do {
      pbVar18 = pbVar14;
      *pbVar18 = (byte)uVar8 | 0x80;
      uVar16 = uVar8 >> 7;
      pbVar14 = pbVar18 + 1;
      bVar19 = 0x3fff < uVar8;
      uVar8 = uVar16;
    } while (bVar19);
  }
  target = pbVar18 + 2;
  *pbVar14 = (byte)uVar16;
  if ((undefined1  [16])((undefined1  [16])(this_01->soo_rep_).field_0 & (undefined1  [16])0x4) ==
      (undefined1  [16])0x0) {
    pcVar10 = (char *)((long)&this->field_0 + 200);
  }
  else {
    pcVar10 = google::protobuf::internal::LongSooRep::elements((LongSooRep *)this_01);
  }
  if ((long)stream->end_ - (long)target < (long)(int)uVar7) goto LAB_001c8ba5;
  memcpy(target,pcVar10,(ulong)uVar7);
  target = target + (int)uVar7;
LAB_001c858b:
  this_02 = &(this->field_0)._impl_.packed_float_;
  iVar6 = google::protobuf::internal::SooRep::size
                    (&this_02->soo_rep_,(*(byte *)((long)&this->field_0 + 0xd0) & 4) == 0);
  if (iVar6 < 1) goto LAB_001c8635;
  if (stream->end_ <= target) {
    target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
  }
  bVar19 = (undefined1  [16])((undefined1  [16])(this_02->soo_rep_).field_0 & (undefined1  [16])0x4)
           == (undefined1  [16])0x0;
  pcVar10 = (char *)(ulong)bVar19;
  iVar6 = google::protobuf::internal::SooRep::size(&this_02->soo_rep_,bVar19);
  if (stream->end_ <= target) {
    _InternalSerialize();
LAB_001c8ba5:
    target = google::protobuf::io::EpsCopyOutputStream::WriteRawFallback
                       (stream,pcVar10,uVar7,target);
    goto LAB_001c858b;
  }
  uVar7 = iVar6 << 2;
  target[0] = 0xa2;
  target[1] = 6;
  pbVar14 = target + 2;
  uVar8 = uVar7;
  if (uVar7 < 0x80) {
    pbVar18 = target + 1;
    uVar16 = uVar7;
  }
  else {
    do {
      pbVar18 = pbVar14;
      *pbVar18 = (byte)uVar8 | 0x80;
      uVar16 = uVar8 >> 7;
      pbVar14 = pbVar18 + 1;
      bVar19 = 0x3fff < uVar8;
      uVar8 = uVar16;
    } while (bVar19);
  }
  target = pbVar18 + 2;
  *pbVar14 = (byte)uVar16;
  if ((undefined1  [16])((undefined1  [16])(this_02->soo_rep_).field_0 & (undefined1  [16])0x4) ==
      (undefined1  [16])0x0) {
    pcVar10 = (char *)((long)&this->field_0 + 0xd8);
  }
  else {
    pcVar10 = google::protobuf::internal::LongSooRep::elements((LongSooRep *)this_02);
  }
  if ((long)stream->end_ - (long)target < (long)(int)uVar7) goto LAB_001c8bfb;
  memcpy(target,pcVar10,(ulong)uVar7);
  target = target + (int)uVar7;
LAB_001c8635:
  this_03 = &(this->field_0)._impl_.packed_double_;
  iVar6 = google::protobuf::internal::SooRep::size
                    (&this_03->soo_rep_,(*(byte *)((long)&this->field_0 + 0xe0) & 4) == 0);
  if (iVar6 < 1) goto LAB_001c86df;
  if (stream->end_ <= target) {
    target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
  }
  bVar19 = (undefined1  [16])((undefined1  [16])(this_03->soo_rep_).field_0 & (undefined1  [16])0x4)
           == (undefined1  [16])0x0;
  pcVar10 = (char *)(ulong)bVar19;
  iVar6 = google::protobuf::internal::SooRep::size(&this_03->soo_rep_,bVar19);
  if (stream->end_ <= target) {
    _InternalSerialize();
LAB_001c8bfb:
    target = google::protobuf::io::EpsCopyOutputStream::WriteRawFallback
                       (stream,pcVar10,uVar7,target);
    goto LAB_001c8635;
  }
  uVar7 = iVar6 << 3;
  target[0] = 0xaa;
  target[1] = 6;
  pbVar14 = target + 2;
  uVar8 = uVar7;
  if (uVar7 < 0x80) {
    pbVar18 = target + 1;
    uVar16 = uVar7;
  }
  else {
    do {
      pbVar18 = pbVar14;
      *pbVar18 = (byte)uVar8 | 0x80;
      uVar16 = uVar8 >> 7;
      pbVar14 = pbVar18 + 1;
      bVar19 = 0x3fff < uVar8;
      uVar8 = uVar16;
    } while (bVar19);
  }
  target = pbVar18 + 2;
  *pbVar14 = (byte)uVar16;
  if ((undefined1  [16])((undefined1  [16])(this_03->soo_rep_).field_0 & (undefined1  [16])0x4) ==
      (undefined1  [16])0x0) {
    pcVar10 = (char *)((long)&this->field_0 + 0xe8);
  }
  else {
    pcVar10 = google::protobuf::internal::LongSooRep::elements((LongSooRep *)this_03);
  }
  if ((long)stream->end_ - (long)target < (long)(int)uVar7) goto LAB_001c8c51;
  memcpy(target,pcVar10,(ulong)uVar7);
  target = target + (int)uVar7;
LAB_001c86df:
  this_04 = &(this->field_0)._impl_.packed_bool_;
  bVar19 = (*(byte *)((long)&this->field_0 + 0xf0) & 4) == 0;
  pbVar14 = (byte *)(ulong)bVar19;
  iVar6 = google::protobuf::internal::SooRep::size(&this_04->soo_rep_,bVar19);
  if (iVar6 < 1) goto LAB_001c8786;
  if (stream->end_ <= target) {
    target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
  }
  bVar19 = (undefined1  [16])((undefined1  [16])(this_04->soo_rep_).field_0 & (undefined1  [16])0x4)
           == (undefined1  [16])0x0;
  pcVar10 = (char *)(ulong)bVar19;
  uVar8 = google::protobuf::internal::SooRep::size(&this_04->soo_rep_,bVar19);
  if (stream->end_ <= target) {
    _InternalSerialize();
LAB_001c8c51:
    target = google::protobuf::io::EpsCopyOutputStream::WriteRawFallback
                       (stream,pcVar10,uVar7,target);
    goto LAB_001c86df;
  }
  target[0] = 0xb2;
  target[1] = 6;
  pbVar14 = target + 2;
  uVar7 = uVar8;
  if (uVar8 < 0x80) {
    pbVar18 = target + 1;
    uVar16 = uVar8;
  }
  else {
    do {
      pbVar18 = pbVar14;
      *pbVar18 = (byte)uVar7 | 0x80;
      uVar16 = uVar7 >> 7;
      pbVar14 = pbVar18 + 1;
      bVar19 = 0x3fff < uVar7;
      uVar7 = uVar16;
    } while (bVar19);
  }
  pbVar18 = pbVar18 + 2;
  *pbVar14 = (byte)uVar16;
  if ((undefined1  [16])((undefined1  [16])(this_04->soo_rep_).field_0 & (undefined1  [16])0x4) ==
      (undefined1  [16])0x0) {
    pbVar14 = (byte *)((long)&this->field_0 + 0xf8);
  }
  else {
    pbVar14 = (byte *)google::protobuf::internal::LongSooRep::elements((LongSooRep *)this_04);
  }
  if ((long)stream->end_ - (long)pbVar18 < (long)(int)uVar8) goto LAB_001c8ca6;
  memcpy(pbVar18,pbVar14,(ulong)uVar8);
  target = pbVar18 + (int)uVar8;
LAB_001c8786:
  do {
    uVar8 = *(uint *)((long)&this->field_0 + 0x110);
    if (uVar8 == 0) goto LAB_001c885d;
    pbVar11 = stream->end_;
    pbVar18 = target;
    if (pbVar11 <= target) {
      pbVar18 = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      pbVar11 = stream->end_;
      pbVar14 = target;
    }
    if (pbVar18 < pbVar11) {
      pRVar1 = &(this->field_0)._impl_.packed_enum_;
      pbVar18[0] = 0xba;
      pbVar18[1] = 6;
      pbVar14 = pbVar18 + 2;
      uVar7 = uVar8;
      if (uVar8 < 0x80) {
        pbVar18 = pbVar18 + 1;
      }
      else {
        do {
          pbVar18 = pbVar14;
          *pbVar18 = (byte)uVar7 | 0x80;
          uVar8 = uVar7 >> 7;
          pbVar14 = pbVar18 + 1;
          bVar19 = 0x3fff < uVar7;
          uVar7 = uVar8;
        } while (bVar19);
      }
      *pbVar14 = (byte)uVar8;
      if ((undefined1  [16])((undefined1  [16])(pRVar1->soo_rep_).field_0 & (undefined1  [16])0x4)
          == (undefined1  [16])0x0) {
        piVar12 = (int *)((long)&this->field_0 + 0x108);
        bVar19 = true;
      }
      else {
        piVar12 = (int *)google::protobuf::internal::LongSooRep::elements((LongSooRep *)pRVar1);
        bVar19 = (undefined1  [16])
                 ((undefined1  [16])(pRVar1->soo_rep_).field_0 & (undefined1  [16])0x4) ==
                 (undefined1  [16])0x0;
      }
      target = pbVar18 + 2;
      iVar6 = google::protobuf::internal::SooRep::size(&pRVar1->soo_rep_,bVar19);
      piVar3 = piVar12 + iVar6;
      do {
        if (stream->end_ <= target) {
          target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
        }
        uVar17 = (ulong)*piVar12;
        uVar13 = uVar17;
        if (0x7f < uVar17) {
          do {
            *target = (byte)uVar13 | 0x80;
            uVar17 = uVar13 >> 7;
            target = target + 1;
            bVar19 = 0x3fff < uVar13;
            uVar13 = uVar17;
          } while (bVar19);
        }
        piVar12 = piVar12 + 1;
        *target = (byte)uVar17;
        target = target + 1;
      } while (piVar12 < piVar3);
LAB_001c885d:
      uVar13 = (this->super_MessageLite)._internal_metadata_.ptr_;
      if ((uVar13 & 1) != 0) {
        uVar13 = uVar13 & 0xfffffffffffffffe;
        data = *(void **)(uVar13 + 8);
        uVar8 = *(uint *)(uVar13 + 0x10);
        if ((long)stream->end_ - (long)target < (long)(int)uVar8) {
          puVar15 = google::protobuf::io::EpsCopyOutputStream::WriteRawFallback
                              (stream,data,uVar8,target);
          return puVar15;
        }
        memcpy(target,data,(ulong)uVar8);
        target = target + (int)uVar8;
      }
      return target;
    }
    _InternalSerialize();
LAB_001c8ca6:
    target = google::protobuf::io::EpsCopyOutputStream::WriteRawFallback
                       (stream,pbVar14,uVar8,pbVar18);
  } while( true );
}

Assistant:

::uint8_t* PROTOBUF_NONNULL TestPackedTypesLite::_InternalSerialize(
    ::uint8_t* PROTOBUF_NONNULL target,
    ::google::protobuf::io::EpsCopyOutputStream* PROTOBUF_NONNULL stream) const {
  const TestPackedTypesLite& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(serialize_to_array_start:proto2_unittest.TestPackedTypesLite)
  ::uint32_t cached_has_bits = 0;
  (void)cached_has_bits;

  // repeated int32 packed_int32 = 90 [features = {
  {
    int byte_size = this_._impl_._packed_int32_cached_byte_size_.Get();
    if (byte_size > 0) {
      target = stream->WriteInt32Packed(
          90, this_._internal_packed_int32(), byte_size, target);
    }
  }

  // repeated int64 packed_int64 = 91 [features = {
  {
    int byte_size = this_._impl_._packed_int64_cached_byte_size_.Get();
    if (byte_size > 0) {
      target = stream->WriteInt64Packed(
          91, this_._internal_packed_int64(), byte_size, target);
    }
  }

  // repeated uint32 packed_uint32 = 92 [features = {
  {
    int byte_size = this_._impl_._packed_uint32_cached_byte_size_.Get();
    if (byte_size > 0) {
      target = stream->WriteUInt32Packed(
          92, this_._internal_packed_uint32(), byte_size, target);
    }
  }

  // repeated uint64 packed_uint64 = 93 [features = {
  {
    int byte_size = this_._impl_._packed_uint64_cached_byte_size_.Get();
    if (byte_size > 0) {
      target = stream->WriteUInt64Packed(
          93, this_._internal_packed_uint64(), byte_size, target);
    }
  }

  // repeated sint32 packed_sint32 = 94 [features = {
  {
    int byte_size = this_._impl_._packed_sint32_cached_byte_size_.Get();
    if (byte_size > 0) {
      target = stream->WriteSInt32Packed(
          94, this_._internal_packed_sint32(), byte_size, target);
    }
  }

  // repeated sint64 packed_sint64 = 95 [features = {
  {
    int byte_size = this_._impl_._packed_sint64_cached_byte_size_.Get();
    if (byte_size > 0) {
      target = stream->WriteSInt64Packed(
          95, this_._internal_packed_sint64(), byte_size, target);
    }
  }

  // repeated fixed32 packed_fixed32 = 96 [features = {
  if (this_._internal_packed_fixed32_size() > 0) {
    target = stream->WriteFixedPacked(96, this_._internal_packed_fixed32(), target);
  }

  // repeated fixed64 packed_fixed64 = 97 [features = {
  if (this_._internal_packed_fixed64_size() > 0) {
    target = stream->WriteFixedPacked(97, this_._internal_packed_fixed64(), target);
  }

  // repeated sfixed32 packed_sfixed32 = 98 [features = {
  if (this_._internal_packed_sfixed32_size() > 0) {
    target = stream->WriteFixedPacked(98, this_._internal_packed_sfixed32(), target);
  }

  // repeated sfixed64 packed_sfixed64 = 99 [features = {
  if (this_._internal_packed_sfixed64_size() > 0) {
    target = stream->WriteFixedPacked(99, this_._internal_packed_sfixed64(), target);
  }

  // repeated float packed_float = 100 [features = {
  if (this_._internal_packed_float_size() > 0) {
    target = stream->WriteFixedPacked(100, this_._internal_packed_float(), target);
  }

  // repeated double packed_double = 101 [features = {
  if (this_._internal_packed_double_size() > 0) {
    target = stream->WriteFixedPacked(101, this_._internal_packed_double(), target);
  }

  // repeated bool packed_bool = 102 [features = {
  if (this_._internal_packed_bool_size() > 0) {
    target = stream->WriteFixedPacked(102, this_._internal_packed_bool(), target);
  }

  // repeated .proto2_unittest.ForeignEnumLite packed_enum = 103 [features = {
  {
    ::size_t byte_size = this_._impl_._packed_enum_cached_byte_size_.Get();
    if (byte_size > 0) {
      target = stream->WriteEnumPacked(
          103, this_._internal_packed_enum(), byte_size, target);
    }
  }

  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    target = stream->WriteRaw(
        this_._internal_metadata_.unknown_fields<std::string>(::google::protobuf::internal::GetEmptyString).data(),
        static_cast<int>(this_._internal_metadata_.unknown_fields<std::string>(::google::protobuf::internal::GetEmptyString).size()), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:proto2_unittest.TestPackedTypesLite)
  return target;
}